

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall
t_rs_generator::render_struct
          (t_rs_generator *this,string *struct_name,t_struct *tstruct,e_struct_type struct_type)

{
  render_type_comment(this,struct_name);
  render_struct_definition(this,struct_name,tstruct,struct_type);
  render_struct_impl(this,struct_name,tstruct,struct_type);
  if ((struct_type == T_EXCEPTION) || (struct_type == T_REGULAR)) {
    render_struct_default_trait_impl(this,struct_name,tstruct);
    if (struct_type == T_EXCEPTION) {
      render_exception_struct_error_trait_impls(this,struct_name,tstruct);
      return;
    }
  }
  return;
}

Assistant:

void t_rs_generator::render_struct(
  const string& struct_name,
  t_struct* tstruct,
  t_rs_generator::e_struct_type struct_type
) {
  render_type_comment(struct_name);
  render_struct_definition(struct_name, tstruct, struct_type);
  render_struct_impl(struct_name, tstruct, struct_type);
  if (struct_type == t_rs_generator::T_REGULAR || struct_type == t_rs_generator::T_EXCEPTION) {
    render_struct_default_trait_impl(struct_name, tstruct);
  }
  if (struct_type == t_rs_generator::T_EXCEPTION) {
    render_exception_struct_error_trait_impls(struct_name, tstruct);
  }
}